

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutGetCone_rec(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  int iVar1;
  uint uVar2;
  If_Obj_t *pIVar3;
  uint local_38;
  int local_34;
  int RetValue;
  int i;
  If_Obj_t *pTemp;
  If_Cut_t *pCut_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  for (local_34 = 0; local_34 < (int)(*(uint *)&pCut->field_0x1c >> 0x18); local_34 = local_34 + 1)
  {
    if ((&pCut[1].Area)[local_34] == (float)pObj->Id) {
      return 1;
    }
    if (pObj->Id < (int)(&pCut[1].Area)[local_34]) break;
  }
  iVar1 = If_ObjIsCi(pObj);
  _RetValue = pObj;
  if (iVar1 == 0) {
    for (; _RetValue != (If_Obj_t *)0x0; _RetValue = _RetValue->pEquiv) {
      pIVar3 = If_ObjFanin0(_RetValue);
      local_38 = If_CutGetCone_rec(p,pIVar3,pCut);
      if (local_38 != 0) {
        pIVar3 = If_ObjFanin1(_RetValue);
        uVar2 = If_CutGetCone_rec(p,pIVar3,pCut);
        local_38 = uVar2 & local_38;
      }
      if (local_38 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int If_CutGetCone_rec( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    If_Obj_t * pTemp;
    int i, RetValue;
    // check if the node is in the cut
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] == pObj->Id )
            return 1;
        else if ( pCut->pLeaves[i] > pObj->Id )
            break;
    // return if we reached the boundary
    if ( If_ObjIsCi(pObj) )
        return 0;
    // check the choice node
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
        // check if the node itself is bound
        RetValue = If_CutGetCone_rec( p, If_ObjFanin0(pTemp), pCut );
        if ( RetValue )
            RetValue &= If_CutGetCone_rec( p, If_ObjFanin1(pTemp), pCut );
        if ( RetValue )
            return 1;
    }
    return 0;
}